

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__zhuffman_decode(stbi__zbuf *a,stbi__zhuffman *z)

{
  uint uVar1;
  ushort uVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  undefined1 auVar7 [16];
  
  if (a->num_bits < 0x10) {
    stbi__fill_bits(a);
  }
  uVar1 = a->code_buffer;
  uVar2 = z->fast[uVar1 & 0x1ff];
  if (uVar2 == 0) {
    auVar7._8_8_ = 0x8040201008040201;
    auVar7._0_8_ = 0x8040201008040201;
    auVar7 = vgf2p8affineqb_avx512vl(ZEXT416(uVar1),auVar7,0);
    uVar2 = auVar7._0_2_ << 8 | auVar7._0_2_ >> 8;
    lVar5 = 0;
    do {
      lVar4 = lVar5;
      lVar5 = lVar4 + 1;
    } while (z->maxcode[lVar4 + 10] <= (int)(uint)uVar2);
    if (lVar5 == 7) {
      uVar3 = 0xffffffff;
    }
    else {
      lVar6 = (ulong)z->firstsymbol[lVar4 + 10] +
              ((ulong)(uVar2 >> ((byte)(7 - (char)lVar5) & 0x1f)) - (ulong)z->firstcode[lVar4 + 10])
      ;
      if ((ulong)*(byte *)((long)z + lVar6 + 0x484) - 9 != lVar5) {
        __assert_fail("z->size[b] == s",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/fjzzq2002[P]MiniShader/stb_image.h"
                      ,0xf98,"int stbi__zhuffman_decode_slowpath(stbi__zbuf *, stbi__zhuffman *)");
      }
      a->code_buffer = uVar1 >> ((int)lVar4 + 10U & 0x1f);
      a->num_bits = (a->num_bits - (int)lVar5) + -9;
      uVar3 = (uint)*(ushort *)((long)z + lVar6 * 2 + 0x5a4);
    }
  }
  else {
    uVar3 = uVar2 & 0x1ff;
    a->code_buffer = uVar1 >> (uVar2 >> 9 & 0x1f);
    a->num_bits = a->num_bits - (uint)(uVar2 >> 9);
  }
  return uVar3;
}

Assistant:

stbi_inline static int stbi__zhuffman_decode(stbi__zbuf *a, stbi__zhuffman *z)
{
   int b,s;
   if (a->num_bits < 16) stbi__fill_bits(a);
   b = z->fast[a->code_buffer & STBI__ZFAST_MASK];
   if (b) {
      s = b >> 9;
      a->code_buffer >>= s;
      a->num_bits -= s;
      return b & 511;
   }
   return stbi__zhuffman_decode_slowpath(a, z);
}